

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void __thiscall Fl_Widget_Type::redraw(Fl_Widget_Type *this)

{
  Fl_Type *pFVar1;
  int iVar2;
  
  iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])();
  if (iVar2 == 0) {
    for (; pFVar1 = (this->super_Fl_Type).parent, pFVar1 != (Fl_Type *)0x0;
        this = (Fl_Widget_Type *)(this->super_Fl_Type).parent) {
      iVar2 = (*pFVar1->_vptr_Fl_Type[0x17])();
      if (iVar2 == 0) break;
    }
    Fl_Widget::redraw(this->o);
    return;
  }
  do {
    this = (Fl_Widget_Type *)(this->super_Fl_Type).parent;
    if (this == (Fl_Widget_Type *)0x0) break;
    iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this);
  } while (iVar2 != 0);
  (*(this->super_Fl_Type)._vptr_Fl_Type[8])(this,0,0);
  return;
}

Assistant:

void Fl_Widget_Type::redraw() {
  Fl_Type *t = this;
  if (is_menu_item()) {
    // find the menu button that parents this menu:
    do t = t->parent; while (t && t->is_menu_item());
    // kludge to cause build_menu to be called again:
    t->add_child(0,0);
  } else {
    while (t->parent && t->parent->is_widget()) t = t->parent;
    ((Fl_Widget_Type*)t)->o->redraw();
  }
}